

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

LogStream * __thiscall LogStream::operator<<(LogStream *this,long v)

{
  formatInteger<long>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<<(long v) {
    formatInteger(v);
    return *this;
}